

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O1

void Rtm_ManFree(Rtm_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  
  pVVar1 = p->vObjs;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vPis;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vPos;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  Aig_MmFlexStop(p->pMem,0);
  if (p->pExtra != (uint *)0x0) {
    free(p->pExtra);
    p->pExtra = (uint *)0x0;
  }
  free(p);
  return;
}

Assistant:

void Rtm_ManFree( Rtm_Man_t * p )
{
    Vec_PtrFree( p->vObjs );
    Vec_PtrFree( p->vPis );
    Vec_PtrFree( p->vPos );
    Aig_MmFlexStop( p->pMem, 0 );
    ABC_FREE( p->pExtra );
    ABC_FREE( p );
}